

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

statement_list * __thiscall
mjs::parser::parse_statement_list
          (statement_list *__return_storage_ptr__,parser *this,bool check_for_strict_mode)

{
  bool bVar1;
  bool bVar2;
  token_type tVar3;
  token *this_00;
  reference puVar4;
  expression_statement *this_01;
  syntax_node *this_02;
  source_extend *extend;
  reference this_03;
  type psVar5;
  __normal_iterator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
  local_50;
  __normal_iterator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
  local_48;
  __normal_iterator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
  local_40;
  iterator it;
  bool strict_mode_active_before;
  byte local_19;
  bool check_for_strict_mode_local;
  parser *this_local;
  statement_list *l;
  
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::vector(__return_storage_ptr__);
  local_19 = check_for_strict_mode;
  while( true ) {
    this_00 = current_token(this);
    bVar1 = token::operator_cast_to_bool(this_00);
    bVar2 = false;
    if (bVar1) {
      tVar3 = current_token_type(this);
      bVar2 = tVar3 != rbrace;
    }
    if (!bVar2) break;
    bVar2 = this->strict_mode_;
    parse_statement((parser *)&it,SUB81(this,0));
    std::
    vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&it);
    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
              ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&it);
    if (((bVar2 & 1U) == 0) && ((this->strict_mode_ & 1U) != 0)) {
      local_40._M_current =
           (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
           std::
           vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ::begin(__return_storage_ptr__);
      while( true ) {
        local_50._M_current =
             (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
             std::
             vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             ::end(__return_storage_ptr__);
        local_48 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
                   ::operator-(&local_50,1);
        bVar2 = __gnu_cxx::operator!=(&local_40,&local_48);
        if (!bVar2) break;
        puVar4 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
                 ::operator*(&local_40);
        psVar5 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                           (puVar4);
        bVar2 = is_directive(psVar5);
        if (!bVar2) {
          __assert_fail("is_directive(**it)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                        ,0x305,"statement_list mjs::parser::parse_statement_list(bool)");
        }
        puVar4 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
                 ::operator*(&local_40);
        this_01 = (expression_statement *)
                  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                            (puVar4);
        this_02 = &expression_statement::e(this_01)->super_syntax_node;
        extend = syntax_node::extend(this_02);
        check_string_literal(this,extend);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
        ::operator++(&local_40);
      }
    }
    if ((local_19 & 1) != 0) {
      this_03 = std::
                vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                ::back(__return_storage_ptr__);
      psVar5 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                         (this_03);
      bVar2 = is_directive(psVar5);
      if (!bVar2) {
        local_19 = 0;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

statement_list parse_statement_list(bool check_for_strict_mode) {
        statement_list l;
        while (current_token() && current_token_type() != token_type::rbrace) {
            const bool strict_mode_active_before = strict_mode_;
            l.push_back(parse_statement(check_for_strict_mode));
            if (!strict_mode_active_before && strict_mode_) {
                // HACK: Strict mode was activated. Now go back and check the string literals before for octal escape sequences.
                for (auto it = l.begin(); it != l.end() - 1; ++it) {
                    assert(is_directive(**it));
                    check_string_literal(static_cast<const expression_statement&>(**it).e().extend());
                }
            }

            // Check if we're still in the directive prologue (ES5.1, 14.1)
            // which is an unbroken sequence of expression statements consisting of just a string literal
            if (check_for_strict_mode && !is_directive(*l.back())) {
                check_for_strict_mode = false;
            }
        }
        return l;
    }